

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resize.c
# Opt level: O0

InterpKernel * choose_interp_filter(int in_length,int out_length)

{
  int iVar1;
  int out_length16;
  int out_length_local;
  int in_length_local;
  int16_t (*local_8) [8];
  
  iVar1 = out_length * 0x10;
  if (iVar1 < in_length * 0x10) {
    if (SBORROW4(iVar1,in_length * 0xd) == iVar1 + in_length * -0xd < 0) {
      local_8 = filteredinterp_filters875;
    }
    else if (SBORROW4(iVar1,in_length * 0xb) == iVar1 + in_length * -0xb < 0) {
      local_8 = filteredinterp_filters750;
    }
    else if (SBORROW4(iVar1,in_length * 9) == iVar1 + in_length * -9 < 0) {
      local_8 = filteredinterp_filters625;
    }
    else {
      local_8 = filteredinterp_filters500;
    }
  }
  else {
    local_8 = av1_resize_filter_normative;
  }
  return local_8;
}

Assistant:

static const InterpKernel *choose_interp_filter(int in_length, int out_length) {
  int out_length16 = out_length * 16;
  if (out_length16 >= in_length * 16)
    return filteredinterp_filters1000;
  else if (out_length16 >= in_length * 13)
    return filteredinterp_filters875;
  else if (out_length16 >= in_length * 11)
    return filteredinterp_filters750;
  else if (out_length16 >= in_length * 9)
    return filteredinterp_filters625;
  else
    return filteredinterp_filters500;
}